

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O2

Transform * __thiscall sf::Transform::getInverse(Transform *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Transform *in_RDI;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar20 [16];
  undefined1 auVar13 [16];
  undefined1 auVar19 [16];
  
  fVar1 = this->m_matrix[0];
  fVar2 = this->m_matrix[1];
  fVar3 = this->m_matrix[0xf];
  fVar4 = this->m_matrix[5];
  fVar5 = this->m_matrix[7];
  fVar6 = this->m_matrix[0xd];
  auVar17._0_4_ = fVar3 * fVar4 - fVar6 * fVar5;
  fVar7 = this->m_matrix[4];
  fVar8 = this->m_matrix[0xc];
  fVar15 = fVar3 * fVar7 - fVar8 * fVar5;
  fVar9 = this->m_matrix[3];
  auVar20._0_4_ = fVar6 * fVar7 - fVar8 * fVar4;
  fVar18 = fVar9 * auVar20._0_4_ + (fVar1 * auVar17._0_4_ - fVar15 * fVar2);
  if ((fVar18 == 0.0) && (!NAN(fVar18))) {
    in_RDI->m_matrix[0xc] = 0.0;
    in_RDI->m_matrix[0xd] = 0.0;
    in_RDI->m_matrix[0xe] = 0.0;
    in_RDI->m_matrix[0xf] = 1.0;
    in_RDI->m_matrix[8] = 0.0;
    in_RDI->m_matrix[9] = 0.0;
    in_RDI->m_matrix[10] = 1.0;
    in_RDI->m_matrix[0xb] = 0.0;
    in_RDI->m_matrix[4] = 0.0;
    in_RDI->m_matrix[5] = 1.0;
    in_RDI->m_matrix[6] = 0.0;
    in_RDI->m_matrix[7] = 0.0;
    in_RDI->m_matrix[0] = 1.0;
    in_RDI->m_matrix[1] = 0.0;
    in_RDI->m_matrix[2] = 0.0;
    in_RDI->m_matrix[3] = 0.0;
    return in_RDI;
  }
  auVar17._4_8_ = 0;
  auVar17._12_4_ = 0x80000000;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._0_8_ = CONCAT44(fVar3 * fVar2 - fVar6 * fVar9,auVar17._0_4_) ^ 0x8000000000000000;
  auVar10._4_4_ = fVar18;
  auVar10._0_4_ = fVar18;
  auVar10._8_4_ = fVar18;
  auVar10._12_4_ = fVar18;
  auVar17 = divps(auVar16,auVar10);
  *(long *)in_RDI->m_matrix = auVar17._0_8_;
  in_RDI->m_matrix[5] = (fVar3 * fVar1 - fVar8 * fVar9) / fVar18;
  auVar20._4_8_ = 0;
  auVar20._12_4_ = 0x80000000;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._0_8_ = CONCAT44(fVar6 * fVar1 + fVar8 * -fVar2,auVar20._0_4_) ^ 0x8000000000000000;
  auVar11._4_4_ = fVar18;
  auVar11._0_4_ = fVar18;
  auVar11._8_4_ = fVar18;
  auVar11._12_4_ = fVar18;
  auVar17 = divps(auVar19,auVar11);
  *(long *)(in_RDI->m_matrix + 0xc) = auVar17._0_8_;
  in_RDI->m_matrix[2] = 0.0;
  in_RDI->m_matrix[6] = 0.0;
  auVar14._0_4_ = fVar2 * fVar5 - fVar4 * fVar9;
  in_RDI->m_matrix[0xe] = 0.0;
  auVar14._4_8_ = 0;
  auVar14._12_4_ = 0x80000000;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._0_8_ = CONCAT44(fVar15,auVar14._0_4_) ^ 0x8000000000000000;
  auVar12._4_4_ = fVar18;
  auVar12._0_4_ = fVar18;
  auVar12._8_4_ = fVar18;
  auVar12._12_4_ = fVar18;
  auVar17 = divps(auVar13,auVar12);
  *(long *)(in_RDI->m_matrix + 3) = auVar17._0_8_;
  in_RDI->m_matrix[7] = -(fVar5 * fVar1 - fVar9 * fVar7) / fVar18;
  in_RDI->m_matrix[8] = 0.0;
  in_RDI->m_matrix[9] = 0.0;
  in_RDI->m_matrix[10] = 1.0;
  in_RDI->m_matrix[0xb] = 0.0;
  in_RDI->m_matrix[0xf] = (fVar4 * fVar1 + fVar7 * -fVar2) / fVar18;
  return in_RDI;
}

Assistant:

Transform Transform::getInverse() const
{
    // Compute the determinant
    float det = m_matrix[0] * (m_matrix[15] * m_matrix[5] - m_matrix[7] * m_matrix[13]) -
                m_matrix[1] * (m_matrix[15] * m_matrix[4] - m_matrix[7] * m_matrix[12]) +
                m_matrix[3] * (m_matrix[13] * m_matrix[4] - m_matrix[5] * m_matrix[12]);

    // Compute the inverse if the determinant is not zero
    // (don't use an epsilon because the determinant may *really* be tiny)
    if (det != 0.f)
    {
        return Transform( (m_matrix[15] * m_matrix[5] - m_matrix[7] * m_matrix[13]) / det,
                         -(m_matrix[15] * m_matrix[4] - m_matrix[7] * m_matrix[12]) / det,
                          (m_matrix[13] * m_matrix[4] - m_matrix[5] * m_matrix[12]) / det,
                         -(m_matrix[15] * m_matrix[1] - m_matrix[3] * m_matrix[13]) / det,
                          (m_matrix[15] * m_matrix[0] - m_matrix[3] * m_matrix[12]) / det,
                         -(m_matrix[13] * m_matrix[0] - m_matrix[1] * m_matrix[12]) / det,
                          (m_matrix[7]  * m_matrix[1] - m_matrix[3] * m_matrix[5])  / det,
                         -(m_matrix[7]  * m_matrix[0] - m_matrix[3] * m_matrix[4])  / det,
                          (m_matrix[5]  * m_matrix[0] - m_matrix[1] * m_matrix[4])  / det);
    }
    else
    {
        return Identity;
    }
}